

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingPriorityQueue.hpp
# Opt level: O2

optional<helics::ActionMessage> * __thiscall
gmlc::containers::BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
::try_pop(optional<helics::ActionMessage> *__return_storage_ptr__,
         BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *this)

{
  ActionMessage *__t;
  pointer pAVar1;
  optional<helics::ActionMessage> *val;
  
  CLI::std::mutex::lock(&this->m_pullLock);
  __t = (this->priorityQueue).c.
        super__Deque_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur;
  if ((this->priorityQueue).c.
      super__Deque_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur == __t) {
    checkPullAndSwap(this);
    pAVar1 = (this->pullElements).
             super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((this->pullElements).
        super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
        super__Vector_impl_data._M_start == pAVar1) {
      (__return_storage_ptr__->super__Optional_base<helics::ActionMessage,_false,_false>)._M_payload
      .super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
      super__Optional_payload_base<helics::ActionMessage>._M_engaged = false;
    }
    else {
      std::optional<helics::ActionMessage>::optional<helics::ActionMessage,_true>
                ((optional<helics::ActionMessage> *)__return_storage_ptr__,pAVar1 + -1);
      std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::pop_back
                ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                 &this->pullElements);
      checkPullAndSwap(this);
    }
  }
  else {
    std::optional<helics::ActionMessage>::optional<helics::ActionMessage,_true>
              ((optional<helics::ActionMessage> *)__return_storage_ptr__,__t);
    CLI::std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::pop_front
              (&(this->priorityQueue).c);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_pullLock);
  return __return_storage_ptr__;
}

Assistant:

std::optional<T> BlockingPriorityQueue<T, MUTEX, COND>::try_pop()
    {
        std::lock_guard<MUTEX> pullLock(m_pullLock);  // first pullLock
        if (!priorityQueue.empty()) {
            std::optional<T> val(std::move(priorityQueue.front()));
            priorityQueue.pop();
            return val;
        }
        checkPullAndSwap();
        if (pullElements.empty()) {
            return std::nullopt;
        }
        // do it this way to allow movable only types
        std::optional<T> val(std::move(pullElements.back()));
        pullElements.pop_back();
        checkPullAndSwap();
        return val;
    }